

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::~Exception(Exception *this)

{
  Detail *pDVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  Detail *pDVar3;
  ArrayDisposer *pAVar4;
  char *pcVar5;
  size_t sVar6;
  
  pDVar1 = (this->details).builder.ptr;
  if (pDVar1 != (Detail *)0x0) {
    pRVar2 = (this->details).builder.pos;
    pDVar3 = (this->details).builder.endPtr;
    (this->details).builder.ptr = (Detail *)0x0;
    (this->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    (this->details).builder.endPtr = (Detail *)0x0;
    pAVar4 = (this->details).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pDVar1,0x20,(long)pRVar2 - (long)pDVar1 >> 5,(long)pDVar3 - (long)pDVar1 >> 5,
               ArrayDisposer::Dispose_<kj::Exception::Detail>::destruct);
  }
  pcVar5 = (this->remoteTrace).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = (this->remoteTrace).content.size_;
    (this->remoteTrace).content.ptr = (char *)0x0;
    (this->remoteTrace).content.size_ = 0;
    pAVar4 = (this->remoteTrace).content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar5,1,sVar6,sVar6,0);
  }
  if ((this->context).ptr.ptr != (Context *)0x0) {
    (this->context).ptr.ptr = (Context *)0x0;
    (**((this->context).ptr.disposer)->_vptr_Disposer)();
  }
  pcVar5 = (this->description).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = (this->description).content.size_;
    (this->description).content.ptr = (char *)0x0;
    (this->description).content.size_ = 0;
    pAVar4 = (this->description).content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar5,1,sVar6,sVar6,0);
  }
  pcVar5 = (this->ownFile).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = (this->ownFile).content.size_;
    pAVar4 = (this->ownFile).content.disposer;
    (this->ownFile).content.ptr = (char *)0x0;
    (this->ownFile).content.size_ = 0;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar5,1,sVar6,sVar6,0);
  }
  return;
}

Assistant:

Exception::~Exception() noexcept {}